

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_77::BinaryReaderIR::OnElseExpr(BinaryReaderIR *this)

{
  Result RVar1;
  IfExpr *pIVar2;
  Enum EVar3;
  Expr *expr;
  LabelNode *label;
  Location local_48;
  
  RVar1 = TopLabelExpr(this,&label,&expr);
  EVar3 = Error;
  if (RVar1.enum_ != Error) {
    if (label->label_type == If) {
      pIVar2 = cast<wabt::IfExpr,wabt::Expr>(expr);
      GetLocation(&local_48,this);
      (pIVar2->true_).end_loc.field_1.field_1.offset = (size_t)local_48.field_1.field_1.offset;
      *(undefined8 *)((long)&(pIVar2->true_).end_loc.field_1 + 8) = local_48.field_1._8_8_;
      (pIVar2->true_).end_loc.filename.data_ = local_48.filename.data_;
      (pIVar2->true_).end_loc.filename.size_ = local_48.filename.size_;
      label->exprs = &pIVar2->false_;
      label->label_type = Else;
      EVar3 = Ok;
    }
    else {
      PrintError(this,"else expression without matching if");
    }
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderIR::OnElseExpr() {
  LabelNode* label;
  Expr* expr;
  CHECK_RESULT(TopLabelExpr(&label, &expr));

  if (label->label_type == LabelType::If) {
    auto* if_expr = cast<IfExpr>(expr);
    if_expr->true_.end_loc = GetLocation();
    label->exprs = &if_expr->false_;
    label->label_type = LabelType::Else;
  } else {
    PrintError("else expression without matching if");
    return Result::Error;
  }

  return Result::Ok;
}